

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.h
# Opt level: O1

Float __thiscall pbrt::Triangle::PDF(Triangle *this,ShapeSampleContext *ctx,Vector3f wi)

{
  float fVar1;
  undefined8 uVar2;
  ulong uVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  float fVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  byte bVar14;
  undefined1 auVar15 [16];
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  Float FVar25;
  undefined1 auVar27 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar28 [16];
  undefined4 uVar26;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 auVar32 [64];
  undefined1 extraout_var_01 [56];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  float fVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar52;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  Point3f PVar56;
  optional<pbrt::ShapeIntersection> isect;
  Ray ray;
  Tuple3<pbrt::Vector3,_float> local_1d8;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  Tuple2<pbrt::Point2,_float> local_178;
  undefined8 uStack_170;
  float local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined1 local_158 [16];
  undefined1 local_148 [256];
  bool local_48;
  Ray local_40;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar36 [56];
  
  local_1d8.z = wi.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar32._8_56_ = wi._8_56_;
  auVar32._0_8_ = wi.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  local_1d8._0_8_ = vmovlps_avx(auVar32._0_16_);
  auVar22._0_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
  auVar22._4_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
  auVar22._8_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
  auVar22._12_4_ =
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
  uVar2 = *(undefined8 *)
           &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high
  ;
  auVar22 = vinsertps_avx(auVar22,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high),
                          0x10);
  auVar23._0_4_ = (float)uVar2 + auVar22._0_4_;
  auVar23._4_4_ = (float)((ulong)uVar2 >> 0x20) + auVar22._4_4_;
  auVar23._8_4_ = auVar22._8_4_ + 0.0;
  auVar23._12_4_ = auVar22._12_4_ + 0.0;
  auVar29._8_4_ = 0x3f000000;
  auVar29._0_8_ = 0x3f0000003f000000;
  auVar29._12_4_ = 0x3f000000;
  auVar22 = vmulps_avx512vl(auVar23,auVar29);
  uVar2 = vmovlps_avx(auVar22);
  local_148._8_4_ =
       ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low +
       (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) *
       0.5;
  local_148._0_8_ = uVar2;
  FVar25 = SolidAngle(this,(Point3f *)local_148);
  if ((FVar25 < 0.0002) || (6.22 < FVar25)) {
    auVar36 = extraout_var_01;
    PVar56 = ShapeSampleContext::OffsetRayOrigin(ctx,(Vector3f *)&local_1d8);
    local_40.o.super_Tuple3<pbrt::Point3,_float>.z = PVar56.super_Tuple3<pbrt::Point3,_float>.z;
    auVar33._0_8_ = PVar56.super_Tuple3<pbrt::Point3,_float>._0_8_;
    auVar33._8_56_ = auVar36;
    local_40.time = ctx->time;
    local_40.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar33._0_16_);
    local_40.d.super_Tuple3<pbrt::Vector3,_float>.x = local_1d8.x;
    local_40.d.super_Tuple3<pbrt::Vector3,_float>.y = local_1d8.y;
    local_40.d.super_Tuple3<pbrt::Vector3,_float>.z = local_1d8.z;
    local_40.medium.
    super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
    .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
             )0;
    Intersect((optional<pbrt::ShapeIntersection> *)local_148,this,&local_40,INFINITY);
    local_168 = 0.0;
    if (local_48 == true) {
      FVar25 = Area(this);
      if (local_48 == false) {
        LogFatal<char_const(&)[4]>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                   ,0xea,"Check failed: %s",(char (*) [4])0x287813c);
      }
      auVar13._8_4_ = 0x80000000;
      auVar13._0_8_ = 0x8000000080000000;
      auVar13._12_4_ = 0x80000000;
      auVar22 = vxorps_avx512vl(ZEXT416((uint)local_1d8.z),auVar13);
      auVar29 = ZEXT416((uint)((float)local_148._48_4_ * auVar22._0_4_));
      auVar22 = vfnmadd132ss_fma(ZEXT416((uint)local_148._44_4_),auVar29,ZEXT416((uint)local_1d8.y))
      ;
      auVar29 = vfnmsub213ss_fma(ZEXT416((uint)local_1d8.z),ZEXT416((uint)local_148._48_4_),auVar29)
      ;
      auVar22 = vfnmadd231ss_fma(ZEXT416((uint)(auVar22._0_4_ + auVar29._0_4_)),
                                 ZEXT416((uint)local_148._40_4_),ZEXT416((uint)local_1d8.x));
      auVar24._8_4_ = 0x7fffffff;
      auVar24._0_8_ = 0x7fffffff7fffffff;
      auVar24._12_4_ = 0x7fffffff;
      auVar24 = vandps_avx512vl(auVar22,auVar24);
      auVar7._0_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar7._4_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar7._8_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar7._12_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      auVar23 = local_148._0_16_;
      auVar13 = local_148._4_16_;
      fVar1 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.
               low + (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high) * 0.5 -
              ((float)local_148._8_4_ + (float)local_148._12_4_) * 0.5;
      auVar22 = vinsertps_avx(auVar7,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low)
                              ,0x10);
      auVar29 = vinsertps_avx(*(undefined1 (*) [16])
                               &(ctx->pi).super_Point3<pbrt::Interval>.
                                super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high,
                              ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                            super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high),0x10)
      ;
      auVar45._0_4_ = (auVar22._0_4_ + auVar29._0_4_) * 0.5;
      auVar45._4_4_ = (auVar22._4_4_ + auVar29._4_4_) * 0.5;
      auVar45._8_4_ = (auVar22._8_4_ + auVar29._8_4_) * 0.5;
      auVar45._12_4_ = (auVar22._12_4_ + auVar29._12_4_) * 0.5;
      auVar22 = vinsertps_avx(auVar23,ZEXT416((uint)local_148._16_4_),0x10);
      auVar29 = vinsertps_avx(auVar13,ZEXT416((uint)local_148._20_4_),0x10);
      auVar48._0_4_ = (auVar22._0_4_ + auVar29._0_4_) * 0.5;
      auVar48._4_4_ = (auVar22._4_4_ + auVar29._4_4_) * 0.5;
      auVar48._8_4_ = (auVar22._8_4_ + auVar29._8_4_) * 0.5;
      auVar48._12_4_ = (auVar22._12_4_ + auVar29._12_4_) * 0.5;
      auVar22 = vsubps_avx(auVar45,auVar48);
      auVar46._0_4_ = auVar22._0_4_ * auVar22._0_4_;
      auVar46._4_4_ = auVar22._4_4_ * auVar22._4_4_;
      auVar46._8_4_ = auVar22._8_4_ * auVar22._8_4_;
      auVar46._12_4_ = auVar22._12_4_ * auVar22._12_4_;
      auVar22 = vmovshdup_avx(auVar46);
      local_168 = (1.0 / FVar25) / (auVar24._0_4_ / (auVar46._0_4_ + fVar1 * fVar1 + auVar22._0_4_))
      ;
      local_168 = (float)((uint)(ABS(local_168) != INFINITY) * (int)local_168);
    }
  }
  else {
    local_168 = 1.0 / FVar25;
    if (((((ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x != 0.0) ||
         ((ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y != 0.0)) ||
        (fVar1 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z, fVar1 != 0.0)) || (NAN(fVar1))) {
      uStack_164 = 0;
      uStack_160 = 0;
      uStack_15c = 0;
      lVar17 = (long)this->triIndex;
      lVar8 = *(long *)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
      lVar16 = *(long *)(lVar8 + 8);
      lVar8 = *(long *)(lVar8 + 0x10);
      lVar18 = (long)*(int *)(lVar16 + lVar17 * 0xc);
      local_188._8_8_ = 0;
      local_188._0_8_ = *(ulong *)(lVar8 + 4 + lVar18 * 0xc);
      lVar19 = (long)*(int *)(lVar16 + 4 + lVar17 * 0xc);
      uVar3 = *(ulong *)(lVar8 + 4 + lVar19 * 0xc);
      local_198._8_8_ = 0;
      local_198._0_8_ = uVar3;
      lVar16 = (long)*(int *)(lVar16 + 8 + lVar17 * 0xc);
      uVar4 = *(ulong *)(lVar8 + lVar16 * 0xc);
      local_1a8._8_8_ = 0;
      local_1a8._0_8_ = uVar4;
      fVar1 = *(float *)(lVar8 + 8 + lVar16 * 0xc);
      local_1c8 = ZEXT416(*(uint *)(lVar8 + lVar19 * 0xc));
      local_1b8 = ZEXT416(*(uint *)(lVar8 + lVar18 * 0xc));
      auVar22 = vpermi2ps_avx512vl(_DAT_00457b10,local_188,local_1b8);
      auVar22 = vinsertps_avx(auVar22,local_1c8,0x30);
      auVar42._16_8_ = uVar3;
      auVar42._0_16_ = auVar22;
      auVar42._24_8_ = 0;
      auVar31._16_8_ = uVar4;
      auVar31._0_16_ = auVar22;
      auVar31._24_8_ = 0;
      local_148._0_32_ = vshufpd_avx(auVar42,auVar31,2);
      auVar5._0_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar5._4_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar5._8_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar5._12_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      uVar2 = *(undefined8 *)
               &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                high;
      auVar22 = vinsertps_avx(auVar5,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high
                                            ),0x10);
      auVar27._0_4_ = (float)uVar2 + auVar22._0_4_;
      auVar27._4_4_ = (float)((ulong)uVar2 >> 0x20) + auVar22._4_4_;
      auVar27._8_4_ = auVar22._8_4_ + 0.0;
      auVar27._12_4_ = auVar22._12_4_ + 0.0;
      auVar10._8_4_ = 0x3f000000;
      auVar10._0_8_ = 0x3f0000003f000000;
      auVar10._12_4_ = 0x3f000000;
      auVar22 = vmulps_avx512vl(auVar27,auVar10);
      local_40.o.super_Tuple3<pbrt::Point3,_float>.z =
           ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.low
           + (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
             high) * 0.5;
      local_40.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar22);
      local_148._32_4_ = fVar1;
      local_178 = (Tuple2<pbrt::Point2,_float>)
                  InvertSphericalTriangleSample
                            ((array<pbrt::Point3<float>,_3> *)local_148,&local_40.o,
                             (Vector3f *)&local_1d8);
      auVar6._0_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.low;
      auVar6._4_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.high;
      auVar6._8_4_ = (ctx->pi).super_Point3<pbrt::Interval>.
                     super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.low;
      auVar6._12_4_ =
           (ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high;
      fVar21 = ((ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.
                low + (ctx->pi).super_Point3<pbrt::Interval>.
                      super_Tuple3<pbrt::Point3,_pbrt::Interval>.z.high) * 0.5;
      uVar2 = *(undefined8 *)
               &(ctx->pi).super_Point3<pbrt::Interval>.super_Tuple3<pbrt::Point3,_pbrt::Interval>.x.
                high;
      auVar22 = vinsertps_avx(auVar6,ZEXT416((uint)(ctx->pi).super_Point3<pbrt::Interval>.
                                                   super_Tuple3<pbrt::Point3,_pbrt::Interval>.y.high
                                            ),0x10);
      auVar28._0_4_ = (float)uVar2 + auVar22._0_4_;
      auVar28._4_4_ = (float)((ulong)uVar2 >> 0x20) + auVar22._4_4_;
      auVar28._8_4_ = auVar22._8_4_ + 0.0;
      auVar28._12_4_ = auVar22._12_4_ + 0.0;
      auVar11._8_4_ = 0x3f000000;
      auVar11._0_8_ = 0x3f0000003f000000;
      auVar11._12_4_ = 0x3f000000;
      auVar23 = vmulps_avx512vl(auVar28,auVar11);
      local_158 = vsubps_avx(local_1a8,auVar23);
      auVar43._0_4_ = local_158._0_4_ * local_158._0_4_;
      auVar43._4_4_ = local_158._4_4_ * local_158._4_4_;
      auVar43._8_4_ = local_158._8_4_ * local_158._8_4_;
      auVar43._12_4_ = local_158._12_4_ * local_158._12_4_;
      auVar22 = vhaddps_avx(auVar43,auVar43);
      fVar1 = fVar1 - fVar21;
      auVar29 = vinsertps_avx(local_198,local_188,0x4c);
      auVar38._4_4_ = fVar21;
      auVar38._0_4_ = fVar21;
      auVar38._8_4_ = fVar21;
      auVar38._12_4_ = fVar21;
      local_1a8 = vsubps_avx(auVar29,auVar38);
      auVar29 = vinsertps_avx(local_1b8,ZEXT416((uint)local_1c8._0_4_),0x10);
      uVar26 = auVar23._0_4_;
      auVar44._4_4_ = uVar26;
      auVar44._0_4_ = uVar26;
      auVar44._8_4_ = uVar26;
      auVar44._12_4_ = uVar26;
      local_1b8 = vsubps_avx(auVar29,auVar44);
      auVar29 = vinsertps_avx(local_188,local_198,0x1c);
      auVar23 = vmovshdup_avx(auVar23);
      local_1c8 = vsubps_avx(auVar29,auVar23);
      fVar21 = local_1b8._0_4_ * local_1b8._0_4_ + local_1c8._0_4_ * local_1c8._0_4_ +
               local_1a8._0_4_ * local_1a8._0_4_;
      uStack_170 = extraout_XMM0_Qb;
      if (fVar21 < 0.0) {
        local_198._0_4_ = fVar1 * fVar1;
        local_188 = auVar22;
        auVar34._0_4_ = sqrtf(fVar21);
        auVar34._4_60_ = extraout_var;
        auVar29 = auVar34._0_16_;
        fVar21 = (float)local_198._0_4_;
        auVar22 = local_188;
      }
      else {
        auVar29 = vsqrtss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
        fVar21 = fVar1 * fVar1;
      }
      fVar21 = auVar22._0_4_ + fVar21;
      auVar22 = vinsertps_avx(local_1a8,local_1b8,0x4c);
      auVar30._0_4_ = auVar22._0_4_ * auVar22._0_4_;
      auVar30._4_4_ = auVar22._4_4_ * auVar22._4_4_;
      auVar30._8_4_ = auVar22._8_4_ * auVar22._8_4_;
      auVar30._12_4_ = auVar22._12_4_ * auVar22._12_4_;
      auVar39._0_4_ = local_1c8._0_4_ * local_1c8._0_4_;
      auVar39._4_4_ = local_1c8._4_4_ * local_1c8._4_4_;
      auVar39._8_4_ = local_1c8._8_4_ * local_1c8._8_4_;
      auVar39._12_4_ = local_1c8._12_4_ * local_1c8._12_4_;
      auVar22 = vmovshdup_avx(auVar39);
      auVar23 = vmovshdup_avx(auVar30);
      fVar9 = auVar30._0_4_ + auVar22._0_4_ + auVar23._0_4_;
      if (fVar9 < 0.0) {
        local_188._0_4_ = fVar21;
        local_198 = auVar29;
        auVar35._0_4_ = sqrtf(fVar9);
        auVar35._4_60_ = extraout_var_00;
        auVar22 = auVar35._0_16_;
        fVar21 = (float)local_188._0_4_;
        auVar29 = local_198;
        auVar23 = local_1a8;
      }
      else {
        auVar22 = vsqrtss_avx(ZEXT416((uint)fVar9),ZEXT416((uint)fVar9));
        auVar23 = local_1a8;
      }
      auVar22 = vinsertps_avx(auVar29,auVar22,0x10);
      local_1a8 = vdivps_avx(local_1b8,auVar22);
      local_1b8 = vdivps_avx(local_1c8,auVar22);
      local_1c8 = vdivps_avx(auVar23,auVar22);
      if (fVar21 < 0.0) {
        fVar21 = sqrtf(fVar21);
      }
      else {
        auVar22 = vsqrtss_avx(ZEXT416((uint)fVar21),ZEXT416((uint)fVar21));
        fVar21 = auVar22._0_4_;
      }
      auVar15._8_8_ = uStack_170;
      auVar15._0_4_ = local_178.x;
      auVar15._4_4_ = local_178.y;
      fVar9 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.z;
      auVar47._4_4_ = fVar9;
      auVar47._0_4_ = fVar9;
      auVar47._8_4_ = fVar9;
      auVar47._12_4_ = fVar9;
      auVar40._0_4_ = local_1c8._0_4_ * fVar9;
      auVar40._4_4_ = local_1c8._4_4_ * fVar9;
      auVar40._8_4_ = local_1c8._8_4_ * fVar9;
      auVar40._12_4_ = local_1c8._12_4_ * fVar9;
      fVar52 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.y;
      auVar49._4_4_ = fVar52;
      auVar49._0_4_ = fVar52;
      auVar49._8_4_ = fVar52;
      auVar49._12_4_ = fVar52;
      auVar22 = vfmadd213ps_fma(local_1b8,auVar49,auVar40);
      auVar29 = vfmsub213ps_fma(local_1c8,auVar47,auVar40);
      auVar41._0_4_ = auVar22._0_4_ + auVar29._0_4_;
      auVar41._4_4_ = auVar22._4_4_ + auVar29._4_4_;
      auVar41._8_4_ = auVar22._8_4_ + auVar29._8_4_;
      auVar41._12_4_ = auVar22._12_4_ + auVar29._12_4_;
      fVar52 = (ctx->ns).super_Tuple3<pbrt::Normal3,_float>.x;
      auVar50._4_4_ = fVar52;
      auVar50._0_4_ = fVar52;
      auVar50._8_4_ = fVar52;
      auVar50._12_4_ = fVar52;
      auVar22 = vfmadd213ps_fma(local_1a8,auVar50,auVar41);
      auVar51._8_4_ = 0x7fffffff;
      auVar51._0_8_ = 0x7fffffff7fffffff;
      auVar51._12_4_ = 0x7fffffff;
      auVar22 = vandps_avx(auVar22,auVar51);
      auVar12._8_4_ = 0x3c23d70a;
      auVar12._0_8_ = 0x3c23d70a3c23d70a;
      auVar12._12_4_ = 0x3c23d70a;
      uVar3 = vcmpps_avx512vl(auVar22,auVar12,0xe);
      fVar52 = 0.0;
      fVar55 = local_178.x;
      if ((0.0 <= fVar55) && (fVar55 <= 1.0)) {
        auVar29 = vmovshdup_avx(auVar15);
        fVar37 = auVar29._0_4_;
        if ((0.0 <= fVar37) && (fVar37 <= 1.0)) {
          auVar29 = vmovshdup_avx(local_158);
          auVar54._0_4_ = local_158._0_4_ / fVar21;
          auVar54._4_12_ = local_158._4_12_;
          auVar53._0_4_ = auVar29._0_4_ / fVar21;
          auVar53._4_12_ = auVar29._4_12_;
          bVar14 = (byte)(uVar3 >> 1);
          auVar29 = vshufps_avx(auVar22,auVar22,0xf5);
          fVar20 = (float)((uint)(bVar14 & 1) * auVar29._0_4_ +
                          (uint)!(bool)(bVar14 & 1) * 0x3c23d70a);
          auVar23 = ZEXT416((uint)((fVar1 / fVar21) * fVar9));
          auVar29 = vfmadd213ss_fma(auVar53,auVar49,auVar23);
          auVar23 = vfmsub213ss_fma(ZEXT416((uint)(fVar1 / fVar21)),auVar47,auVar23);
          auVar29 = vfmadd231ss_fma(ZEXT416((uint)(auVar23._0_4_ + auVar29._0_4_)),auVar50,auVar54);
          auVar29 = vandps_avx(auVar29,auVar51);
          auVar29 = vmaxss_avx(auVar29,SUB6416(ZEXT464(0x3c23d70a),0));
          fVar21 = (float)((uint)((byte)uVar3 & 1) * auVar22._0_4_ +
                          (uint)!(bool)((byte)uVar3 & 1) * 0x3c23d70a);
          fVar1 = fVar20 + fVar20 + fVar21 + auVar29._0_4_;
          fVar52 = 1.0;
          if ((fVar1 != 0.0) || (NAN(fVar1))) {
            auVar22 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * fVar55 * (1.0 - fVar37))),
                                      ZEXT416((uint)fVar20),
                                      ZEXT416((uint)((1.0 - fVar55) * (1.0 - fVar37))));
            auVar22 = vfmadd213ss_fma(ZEXT416((uint)fVar21),ZEXT416((uint)(fVar37 * (1.0 - fVar55)))
                                      ,auVar22);
            auVar22 = vfmadd213ss_fma(auVar29,ZEXT416((uint)(fVar55 * fVar37)),auVar22);
            fVar52 = (auVar22._0_4_ * 4.0) / fVar1;
          }
        }
      }
      local_168 = local_168 * fVar52;
    }
  }
  return local_168;
}

Assistant:

PBRT_CPU_GPU
    Float PDF(const ShapeSampleContext &ctx, Vector3f wi) const {
        Float solidAngle = SolidAngle(ctx.p());
        // Return PDF based on uniform area sampling for challenging triangles
        if (solidAngle < MinSphericalSampleArea || solidAngle > MaxSphericalSampleArea) {
            // Intersect sample ray with shape geometry
            Ray ray = ctx.SpawnRay(wi);
            pstd::optional<ShapeIntersection> isect = Intersect(ray);
            if (!isect)
                return 0;

            // Compute PDF in solid angle measure from shape intersection point
            Float pdf = (1 / Area()) / (AbsDot(isect->intr.n, -wi) /
                                        DistanceSquared(ctx.p(), isect->intr.p()));
            if (IsInf(pdf))
                pdf = 0;

            return pdf;
        }

        Float pdf = 1 / solidAngle;
        // Adjust PDF for warp product sampling of triangle $\cos \theta$ factor
        if (ctx.ns != Normal3f(0, 0, 0)) {
            // Get triangle vertices in _p0_, _p1_, and _p2_
            const TriangleMesh *mesh = GetMesh();
            const int *v = &mesh->vertexIndices[3 * triIndex];
            Point3f p0 = mesh->p[v[0]], p1 = mesh->p[v[1]], p2 = mesh->p[v[2]];

            Point2f u = InvertSphericalTriangleSample({p0, p1, p2}, ctx.p(), wi);
            // Compute $\cos \theta$-based weights _w_ at sample domain corners
            Point3f rp = ctx.p();
            Vector3f wi[3] = {Normalize(p0 - rp), Normalize(p1 - rp), Normalize(p2 - rp)};
            pstd::array<Float, 4> w =
                pstd::array<Float, 4>{std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[1])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[0])),
                                      std::max<Float>(0.01, AbsDot(ctx.ns, wi[2]))};

            pdf *= BilinearPDF(u, w);
        }

        return pdf;
    }